

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void phsubd_(PDISASM pMyDisasm)

{
  undefined4 uVar1;
  long lVar2;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
LAB_0012916e:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    uVar1 = 0xffffffff;
    lVar2 = 0x924;
  }
  else {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      if ((pMyDisasm->Reserved_).VEX.pp != '\x01') goto LAB_0012916e;
      (pMyDisasm->Instruction).Category = 0x110002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vphsubd",8);
      ArgsVEX(pMyDisasm);
    }
    else {
      if ((pMyDisasm->Prefix).OperandSize == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
        (pMyDisasm->Prefix).OperandSize = '\b';
        (pMyDisasm->Instruction).Category = 0x70002;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"phsubd",7);
        (pMyDisasm->Reserved_).MemDecoration = 0x6d;
        (pMyDisasm->Reserved_).Register_ = 4;
      }
      else {
        if (((pMyDisasm->Reserved_).PrefRepe == 1) || ((pMyDisasm->Reserved_).PrefRepne == 1))
        goto LAB_0012916e;
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        (pMyDisasm->Instruction).Category = 0x70002;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"phsubd",7);
        (pMyDisasm->Reserved_).Register_ = 2;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    }
    uVar1 = 3;
    lVar2 = 0x1c8;
  }
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar2 + -0x14) = uVar1;
  return;
}

Assistant:

void __bea_callspec__ phsubd_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  } else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vphsubd");
      #endif
      ArgsVEX(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "phsubd");
    #endif
    GV.MemDecoration = Arg2_m128_xmm;
    GV.Register_ = SSE_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
    GV.MemDecoration = Arg2qword;
    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "phsubd");
    #endif
    GV.Register_ = MMX_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
}